

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  ulong uVar1;
  ulong *puVar2;
  int iVar3;
  int *piVar4;
  int queryPlayback;
  uint uVar5;
  uint uVar6;
  ulong numFrames;
  char *format;
  PaAlsaStream *pPVar7;
  uint uVar8;
  pollfd *pfds;
  ulong uVar9;
  pollfd *pfds_00;
  bool bVar10;
  bool bVar11;
  int local_74;
  int pollCapture;
  int pollPlayback;
  ulong *local_68;
  PaAlsaStream *local_60;
  int pollTimeout;
  PaAlsaStreamComponent *local_50;
  PaAlsaStreamComponent *local_48;
  ulong local_40;
  int *local_38;
  
  bVar10 = (self->playback).pcm != (snd_pcm_t *)0x0;
  pollPlayback = (int)bVar10;
  bVar11 = (self->capture).pcm != (snd_pcm_t *)0x0;
  pollCapture = (int)bVar11;
  pollTimeout = self->pollTimeout;
  local_74 = 0;
  local_68 = framesAvail;
  local_38 = xrunOccurred;
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xeb2,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames
                           (self,pollCapture,pollPlayback,framesAvail,&local_74);
    if (-1 < paUtilErr_) {
      if (local_74 != 0) {
LAB_0010da9e:
        uVar9 = 0;
        iVar3 = local_74;
        goto LAB_0010dbe8;
      }
      if (*local_68 != 0) {
        if ((self->capture).pcm != (snd_pcm_t *)0x0) {
          (self->capture).ready = 1;
        }
        uVar9 = 0;
        iVar3 = local_74;
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          (self->playback).ready = 1;
        }
        goto LAB_0010dbe8;
      }
      goto LAB_0010d809;
    }
    format = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
    ;
  }
  else {
LAB_0010d809:
    local_48 = &self->playback;
    local_50 = &self->capture;
    uVar9 = 0;
    uVar8 = (uint)bVar10;
    uVar5 = (uint)bVar11;
    local_60 = self;
LAB_0010d829:
    do {
      if (uVar8 == 0 && uVar5 == 0) {
        if (local_74 != 0) goto LAB_0010da9e;
        queryPlayback = 0;
        iVar3 = 0;
        if ((self->capture).pcm != (snd_pcm_t *)0x0) {
          iVar3 = (self->capture).ready;
        }
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          queryPlayback = (self->playback).ready;
        }
        paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,iVar3,queryPlayback,local_68,&local_74);
        puVar2 = local_68;
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3894\n"
          ;
          goto LAB_0010dc98;
        }
        iVar3 = local_74;
        if ((self->capture).pcm == (snd_pcm_t *)0x0) {
          if ((self->playback).ready == 0) {
            __assert_fail("self->playback.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xf47,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
        }
        else {
          if ((self->playback).pcm != (snd_pcm_t *)0x0) {
            uVar9 = 0;
            if (((self->playback).ready == 0) && (uVar9 = 0, self->neverDropInput == 0)) {
              if ((self->capture).ready == 0) {
                __assert_fail("self->capture.ready",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                              ,0xf3d,
                              "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                             );
              }
              uVar1 = (self->capture).framesPerPeriod;
              numFrames = *local_68;
              if (uVar1 < *local_68) {
                numFrames = uVar1;
              }
              PaAlsaStreamComponent_EndProcessing(local_50,numFrames,&local_74);
              *puVar2 = 0;
              (self->capture).ready = 0;
              iVar3 = local_74;
            }
            goto LAB_0010dbe8;
          }
          if ((self->capture).ready == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xf45,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
        }
        uVar9 = 0;
        goto LAB_0010dbe8;
      }
      pthread_testcancel();
      local_40 = uVar9;
      if (uVar5 == 0) {
        pfds = (pollfd *)0x0;
        if (uVar8 != 0) {
          uVar6 = 0;
          uVar9 = 0;
          goto LAB_0010d87a;
        }
        uVar6 = 0;
LAB_0010d8b6:
        bVar10 = true;
        pfds_00 = (pollfd *)0x0;
        pPVar7 = local_60;
      }
      else {
        pfds = self->pfds;
        PaAlsaStreamComponent_BeginPolling(local_50,pfds);
        paUtilErr_ = 0;
        uVar6 = (self->capture).nfds;
        uVar9 = (ulong)uVar6;
        if (uVar8 == 0) goto LAB_0010d8b6;
LAB_0010d87a:
        pPVar7 = local_60;
        pfds_00 = local_60->pfds + uVar9;
        PaAlsaStreamComponent_BeginPolling(local_48,pfds_00);
        paUtilErr_ = 0;
        uVar6 = uVar6 + (pPVar7->playback).nfds;
        bVar10 = false;
      }
      iVar3 = poll((pollfd *)pPVar7->pfds,(long)(int)uVar6,pollTimeout);
      self = local_60;
      if (iVar3 < 0) {
        piVar4 = __errno_location();
        if (*piVar4 != 4) {
          paUtilErr_ = -0x2702;
          PaUtil_DebugPrint(
                           "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3821\n"
                           );
          uVar9 = (ulong)(uint)paUtilErr_;
          iVar3 = local_74;
          self = local_60;
          goto LAB_0010dbe8;
        }
        Pa_Sleep(1);
        uVar9 = local_40 & 0xffffffff;
        self = local_60;
        uVar8 = pollPlayback;
        uVar5 = pollCapture;
        goto LAB_0010d829;
      }
      if (iVar3 == 0) {
        uVar8 = (uint)local_40;
        uVar9 = (ulong)(uVar8 + 1);
        if ((0 < (int)uVar8) && (Pa_Sleep(1), 0x7fe < uVar8)) {
          *local_68 = 0;
          uVar9 = 0;
          iVar3 = 1;
          goto LAB_0010dbe8;
        }
      }
      else {
        if ((uVar5 != 0) &&
           (paUtilErr_ = PaAlsaStreamComponent_EndPolling(local_50,pfds,&pollCapture,&local_74),
           paUtilErr_ < 0)) {
          format = 
          "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3856\n"
          ;
          goto LAB_0010dc98;
        }
        if ((!bVar10) &&
           (paUtilErr_ = PaAlsaStreamComponent_EndPolling(local_48,pfds_00,&pollPlayback,&local_74),
           paUtilErr_ < 0)) {
          format = 
          "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3860\n"
          ;
          goto LAB_0010dc98;
        }
        uVar9 = 0;
        iVar3 = local_74;
        if (local_74 != 0) goto LAB_0010dbe8;
      }
      uVar8 = pollPlayback;
      uVar5 = pollCapture;
    } while (((self->capture).pcm == (snd_pcm_t *)0x0) || ((self->playback).pcm == (snd_pcm_t *)0x0)
            );
    if (pollPlayback != 0 || pollCapture == 0) {
      if ((pollCapture == 0 && pollPlayback != 0) &&
         (paUtilErr_ = ContinuePoll(self,StreamDirection_Out,&pollTimeout,&pollPlayback),
         uVar8 = pollPlayback, uVar5 = pollCapture, paUtilErr_ < 0)) {
        format = 
        "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3880\n"
        ;
        goto LAB_0010dc98;
      }
      goto LAB_0010d829;
    }
    paUtilErr_ = ContinuePoll(self,StreamDirection_In,&pollTimeout,&pollCapture);
    uVar8 = pollPlayback;
    uVar5 = pollCapture;
    if (-1 < paUtilErr_) goto LAB_0010d829;
    format = 
    "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3876\n"
    ;
  }
LAB_0010dc98:
  PaUtil_DebugPrint(format);
  uVar9 = (ulong)(uint)paUtilErr_;
  iVar3 = local_74;
LAB_0010dbe8:
  do {
    if (iVar3 != 0) {
      paUtilErr_ = PaAlsaStream_HandleXrun(self);
      if (-1 < paUtilErr_) {
        *local_68 = 0;
LAB_0010dc4a:
        *local_38 = iVar3;
        return (PaError)uVar9;
      }
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3919\n"
                       );
      uVar9 = (ulong)(uint)paUtilErr_;
      goto LAB_0010dbe8;
    }
    if (((*local_68 == 0) || ((self->capture).ready != 0)) || ((self->playback).ready != 0))
    goto LAB_0010dc4a;
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3927\n"
                     );
    uVar9 = 0xffffd8fe;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

        pollResults = poll( self->pfds, totalFds, pollTimeout );

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}